

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

IceTSparseImage icetSparseImageAssignBuffer(IceTVoid *buffer,IceTSizeType width,IceTSizeType height)

{
  IceTVoid *pIVar1;
  IceTInt *header;
  IceTEnum depth_format;
  IceTEnum color_format;
  IceTSizeType height_local;
  IceTSizeType width_local;
  IceTVoid *buffer_local;
  IceTSparseImage image;
  
  depth_format = height;
  color_format = width;
  _height_local = buffer;
  buffer_local = buffer;
  if (buffer == (IceTVoid *)0x0) {
    icetRaiseDiagnostic("Tried to create sparse image with NULL buffer.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x191);
  }
  else {
    icetGetEnumv(9,(IceTEnum *)((long)&header + 4));
    icetGetEnumv(10,(IceTEnum *)&header);
    pIVar1 = buffer_local;
    if (((header._4_4_ != 0xc001) && (header._4_4_ != 0xc002)) && (header._4_4_ != 0xc000)) {
      icetRaiseDiagnostic("Invalid color format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x19d);
      header._4_4_ = 0xc000;
    }
    if (((int)header != 0xd001) && ((int)header != 0xd000)) {
      icetRaiseDiagnostic("Invalid depth format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x1a2);
      header._0_4_ = 0xd000;
    }
    *(undefined4 *)pIVar1 = 0x4d6000;
    *(int *)((long)pIVar1 + 4) = header._4_4_;
    *(int *)((long)pIVar1 + 8) = (int)header;
    *(IceTEnum *)((long)pIVar1 + 0xc) = color_format;
    *(IceTEnum *)((long)pIVar1 + 0x10) = depth_format;
    *(IceTEnum *)((long)pIVar1 + 0x14) = color_format * depth_format;
    *(undefined4 *)((long)pIVar1 + 0x18) = 0;
    icetClearSparseImage((IceTSparseImage)buffer_local);
  }
  return (IceTSparseImage)buffer_local;
}

Assistant:

IceTSparseImage icetSparseImageAssignBuffer(IceTVoid *buffer,
                                            IceTSizeType width,
                                            IceTSizeType height)
{
    IceTSparseImage image;
    IceTEnum color_format, depth_format;
    IceTInt *header;

    image.opaque_internals = buffer;

    if (buffer == NULL) {
        icetRaiseError("Tried to create sparse image with NULL buffer.",
                       ICET_INVALID_VALUE);
        return image;
    }

    icetGetEnumv(ICET_COLOR_FORMAT, &color_format);
    icetGetEnumv(ICET_DEPTH_FORMAT, &depth_format);

    header = ICET_IMAGE_HEADER(image);

    if (   (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE)
        && (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT)
        && (color_format != ICET_IMAGE_COLOR_NONE) ) {
        icetRaiseError("Invalid color format.", ICET_INVALID_ENUM);
        color_format = ICET_IMAGE_COLOR_NONE;
    }
    if (   (depth_format != ICET_IMAGE_DEPTH_FLOAT)
        && (depth_format != ICET_IMAGE_DEPTH_NONE) ) {
        icetRaiseError("Invalid depth format.", ICET_INVALID_ENUM);
        depth_format = ICET_IMAGE_DEPTH_NONE;
    }

    header[ICET_IMAGE_MAGIC_NUM_INDEX]          = ICET_SPARSE_IMAGE_MAGIC_NUM;
    header[ICET_IMAGE_COLOR_FORMAT_INDEX]       = color_format;
    header[ICET_IMAGE_DEPTH_FORMAT_INDEX]       = depth_format;
    header[ICET_IMAGE_WIDTH_INDEX]              = (IceTInt)width;
    header[ICET_IMAGE_HEIGHT_INDEX]             = (IceTInt)height;
    header[ICET_IMAGE_MAX_NUM_PIXELS_INDEX]     = (IceTInt)(width*height);
    header[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX] = 0;

  /* Make sure the runlengths are valid. */
    icetClearSparseImage(image);

    return image;
}